

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::GetStructMemberTypes
          (ValidationState_t *this,uint32_t struct_type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *member_types)

{
  pointer puVar1;
  Instruction *pIVar2;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  puVar1 = (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (struct_type_id != 0) {
    pIVar2 = FindDef(this,struct_type_id);
    if (pIVar2 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4a9,
                    "bool spvtools::val::ValidationState_t::GetStructMemberTypes(uint32_t, std::vector<uint32_t> *) const"
                   );
    }
    if ((pIVar2->inst_).opcode == 0x1e) {
      local_28 = (void *)0x0;
      uStack_20 = 0;
      local_18 = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_28,
                 (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (member_types,&local_28);
      if (local_28 != (void *)0x0) {
        operator_delete(local_28,local_18 - (long)local_28);
      }
      return (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start !=
             (member_types->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::GetStructMemberTypes(
    uint32_t struct_type_id, std::vector<uint32_t>* member_types) const {
  member_types->clear();
  if (!struct_type_id) return false;

  const Instruction* inst = FindDef(struct_type_id);
  assert(inst);
  if (inst->opcode() != spv::Op::OpTypeStruct) return false;

  *member_types =
      std::vector<uint32_t>(inst->words().cbegin() + 2, inst->words().cend());

  if (member_types->empty()) return false;

  return true;
}